

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall
SimpleLogger::findMinMaxRevNum(SimpleLogger *this,size_t *min_revnum_out,size_t *max_revnum_out)

{
  char *pcVar1;
  long lVar2;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  string *in_RDI;
  bool bVar3;
  size_t f_name_pos;
  string f_name;
  dirent *dir_entry;
  DIR *dir_info;
  size_t max_revnum;
  size_t min_revnum;
  bool min_revnum_initialized;
  size_t last_pos;
  string file_name_only;
  string dir_path;
  allocator local_101;
  string local_100 [32];
  dirent *local_e0;
  DIR *local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined1 local_b9;
  string local_b8 [32];
  string local_98 [32];
  long local_78;
  string *in_stack_ffffffffffffff90;
  size_t *in_stack_ffffffffffffff98;
  size_t *in_stack_ffffffffffffffa0;
  bool *in_stack_ffffffffffffffa8;
  SimpleLogger *in_stack_ffffffffffffffb0;
  allocator local_39;
  string local_38 [32];
  undefined8 *local_18;
  undefined8 *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"./",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff90,in_RDI);
  local_78 = std::__cxx11::string::rfind((char *)in_RDI,0x117456);
  if (local_78 != -1) {
    std::__cxx11::string::substr((ulong)local_98,(ulong)in_RDI);
    std::__cxx11::string::operator=(local_38,local_98);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_b8,(ulong)in_RDI);
    std::__cxx11::string::operator=((string *)&stack0xffffffffffffff90,local_b8);
    std::__cxx11::string::~string(local_b8);
  }
  local_b9 = 0;
  local_c8 = 0;
  local_d0 = 0;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  local_d8 = opendir(pcVar1);
  local_e0 = (dirent *)0x0;
  while( true ) {
    bVar3 = false;
    if (local_d8 != (DIR *)0x0) {
      local_e0 = readdir(local_d8);
      bVar3 = local_e0 != (dirent *)0x0;
    }
    if (!bVar3) break;
    pcVar1 = local_e0->d_name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,pcVar1,&local_101);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    lVar2 = std::__cxx11::string::rfind(local_100,(ulong)&stack0xffffffffffffff90);
    if (lVar2 != -1) {
      findMinMaxRevNumInternal
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    std::__cxx11::string::~string(local_100);
  }
  if (local_d8 != (DIR *)0x0) {
    closedir(local_d8);
  }
  *local_10 = local_c8;
  *local_18 = local_d0;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void SimpleLogger::findMinMaxRevNum( size_t& min_revnum_out,
                                     size_t& max_revnum_out )
{
    std::string dir_path = "./";
    std::string file_name_only = filePath;
    size_t last_pos = filePath.rfind("/");
    if (last_pos != std::string::npos) {
        dir_path = filePath.substr(0, last_pos);
        file_name_only = filePath.substr
                         ( last_pos + 1, filePath.size() - last_pos - 1 );
    }

    bool min_revnum_initialized = false;
    size_t min_revnum = 0;
    size_t max_revnum = 0;

#if defined(__linux__) || defined(__APPLE__)
    DIR* dir_info = opendir(dir_path.c_str());
    struct dirent *dir_entry = nullptr;
    while ( dir_info && (dir_entry = readdir(dir_info)) ) {
        std::string f_name(dir_entry->d_name);
        size_t f_name_pos = f_name.rfind(file_name_only);
        // Irrelavent file: skip.
        if (f_name_pos == std::string::npos) continue;

        findMinMaxRevNumInternal(min_revnum_initialized,
                                 min_revnum,
                                 max_revnum,
                                 f_name);
    }
    if (dir_info) {
        closedir(dir_info);
    }
#elif defined(WIN32) || defined(_WIN32)
    // Windows
    WIN32_FIND_DATA filedata;
    HANDLE hfind;
    std::string query_str = dir_path + "*";

    // find all files start with 'prefix'
    hfind = FindFirstFile(query_str.c_str(), &filedata);
    while (hfind != INVALID_HANDLE_VALUE) {
        std::string f_name(filedata.cFileName);
        size_t f_name_pos = f_name.rfind(file_name_only);
        // Irrelavent file: skip.
        if (f_name_pos != std::string::npos) {
            findMinMaxRevNumInternal(min_revnum_initialized,
                                     min_revnum,
                                     max_revnum,
                                     f_name);
        }

        if (!FindNextFile(hfind, &filedata)) {
            FindClose(hfind);
            hfind = INVALID_HANDLE_VALUE;
        }
    }
#endif

    min_revnum_out = min_revnum;
    max_revnum_out = max_revnum;
}